

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowBase.cpp
# Opt level: O3

bool __thiscall sf::WindowBase::waitEvent(WindowBase *this,Event *event)

{
  bool bVar1;
  
  if ((this->m_impl != (WindowImpl *)0x0) &&
     (bVar1 = priv::WindowImpl::popEvent(this->m_impl,event,true), bVar1)) {
    if (event->type != Resized) {
      return true;
    }
    (this->m_size).x = (event->field_1).size.width;
    (this->m_size).y = (event->field_1).size.height;
    (*this->_vptr_WindowBase[6])(this);
    return true;
  }
  return false;
}

Assistant:

bool WindowBase::waitEvent(Event& event)
{
    if (m_impl && m_impl->popEvent(event, true))
    {
        return filterEvent(event);
    }
    else
    {
        return false;
    }
}